

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdh(secp256k1_context *ctx,uchar *output,secp256k1_pubkey *point,uchar *scalar,
                  secp256k1_ecdh_hash_function hashfp,void *data)

{
  int flag;
  int iVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  code *in_R8;
  undefined8 in_R9;
  uchar y [32];
  uchar x [32];
  secp256k1_scalar s;
  secp256k1_ge pt;
  secp256k1_gej res;
  int overflow;
  int ret;
  secp256k1_scalar *in_stack_00000880;
  secp256k1_ge *in_stack_00000888;
  secp256k1_gej *in_stack_00000890;
  secp256k1_fe *in_stack_fffffffffffffe58;
  secp256k1_callback *in_stack_fffffffffffffe60;
  uchar *in_stack_fffffffffffffe68;
  secp256k1_scalar *in_stack_fffffffffffffe70;
  undefined1 local_188 [32];
  secp256k1_pubkey *in_stack_fffffffffffffe98;
  secp256k1_ge *in_stack_fffffffffffffea0;
  secp256k1_context *in_stack_fffffffffffffea8;
  secp256k1_gej *in_stack_fffffffffffffeb8;
  secp256k1_ge *in_stack_fffffffffffffec0;
  code *local_30;
  uint local_4;
  
  if (in_RDI == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/ecdh/main_impl.h"
            ,0x26,"test condition failed: ctx != NULL");
    abort();
  }
  if (in_RSI == 0) {
    secp256k1_callback_call(in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58);
    local_4 = 0;
  }
  else if (in_RDX == 0) {
    secp256k1_callback_call(in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58);
    local_4 = 0;
  }
  else if (in_RCX == 0) {
    secp256k1_callback_call(in_stack_fffffffffffffe60,(char *)in_stack_fffffffffffffe58);
    local_4 = 0;
  }
  else {
    local_30 = in_R8;
    if (in_R8 == (code *)0x0) {
      local_30 = ecdh_hash_function_sha256;
    }
    secp256k1_pubkey_load
              (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    secp256k1_scalar_set_b32
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,(int *)in_stack_fffffffffffffe60)
    ;
    flag = secp256k1_scalar_is_zero((secp256k1_scalar *)&stack0xfffffffffffffea0);
    secp256k1_scalar_cmov((secp256k1_scalar *)&stack0xfffffffffffffea0,&secp256k1_scalar_one,flag);
    secp256k1_ecmult_const(in_stack_00000890,in_stack_00000888,in_stack_00000880);
    secp256k1_ge_set_gej(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    secp256k1_fe_normalize((secp256k1_fe *)0x1067bb);
    secp256k1_fe_normalize((secp256k1_fe *)0x1067c9);
    secp256k1_fe_get_b32((uchar *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    secp256k1_fe_get_b32((uchar *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    iVar1 = (*local_30)(in_RSI,local_188,&stack0xfffffffffffffe58,in_R9);
    memset(local_188,0,0x20);
    memset(&stack0xfffffffffffffe58,0,0x20);
    secp256k1_scalar_clear((secp256k1_scalar *)&stack0xfffffffffffffea0);
    local_4 = (uint)(iVar1 != 0 & (flag != 0 ^ 0xffU) & 1);
  }
  return local_4;
}

Assistant:

int secp256k1_ecdh(const secp256k1_context* ctx, unsigned char *output, const secp256k1_pubkey *point, const unsigned char *scalar, secp256k1_ecdh_hash_function hashfp, void *data) {
    int ret = 0;
    int overflow = 0;
    secp256k1_gej res;
    secp256k1_ge pt;
    secp256k1_scalar s;
    unsigned char x[32];
    unsigned char y[32];

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(point != NULL);
    ARG_CHECK(scalar != NULL);

    if (hashfp == NULL) {
        hashfp = secp256k1_ecdh_hash_function_default;
    }

    secp256k1_pubkey_load(ctx, &pt, point);
    secp256k1_scalar_set_b32(&s, scalar, &overflow);

    overflow |= secp256k1_scalar_is_zero(&s);
    secp256k1_scalar_cmov(&s, &secp256k1_scalar_one, overflow);

    secp256k1_ecmult_const(&res, &pt, &s);
    secp256k1_ge_set_gej(&pt, &res);

    /* Compute a hash of the point */
    secp256k1_fe_normalize(&pt.x);
    secp256k1_fe_normalize(&pt.y);
    secp256k1_fe_get_b32(x, &pt.x);
    secp256k1_fe_get_b32(y, &pt.y);

    ret = hashfp(output, x, y, data);

    memset(x, 0, 32);
    memset(y, 0, 32);
    secp256k1_scalar_clear(&s);

    return !!ret & !overflow;
}